

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3NextMethod(sqlite3_vtab_cursor *pCursor)

{
  int *piVar1;
  u8 uVar2;
  sqlite3_vtab *psVar3;
  Fts3Expr *pExpr;
  int iVar4;
  sqlite3_vtab *psVar5;
  long in_FS_OFFSET;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(ushort *)&pCursor[1].pVtab < 2) {
    psVar3 = pCursor->pVtab;
    piVar1 = &psVar3[4].nRef;
    *piVar1 = *piVar1 + 1;
    iVar4 = sqlite3_step((sqlite3_stmt *)pCursor[2].pVtab);
    if (iVar4 == 100) {
      iVar4 = 0;
      psVar5 = (sqlite3_vtab *)sqlite3_column_int64((sqlite3_stmt *)pCursor[2].pVtab,0);
      pCursor[6].pVtab = psVar5;
    }
    else {
      *(undefined1 *)((long)&pCursor[1].pVtab + 2) = 1;
      iVar4 = sqlite3_reset((sqlite3_stmt *)pCursor[2].pVtab);
    }
    piVar1 = &psVar3[4].nRef;
    *piVar1 = *piVar1 + -1;
    goto LAB_001adf5f;
  }
  local_2c = 0;
  pExpr = (Fts3Expr *)pCursor[3].pVtab;
  if (pExpr == (Fts3Expr *)0x0) {
    *(undefined1 *)((long)&pCursor[1].pVtab + 2) = 1;
  }
  else {
    do {
      if (*(char *)((long)&pCursor[1].pVtab + 3) == '\0') {
        sqlite3_reset((sqlite3_stmt *)pCursor[2].pVtab);
      }
      fts3EvalNextRow((Fts3Cursor *)pCursor,pExpr,&local_2c);
      uVar2 = pExpr->bEof;
      *(u8 *)((long)&pCursor[1].pVtab + 2) = uVar2;
      *(undefined1 *)((long)&pCursor[1].pVtab + 3) = 1;
      *(undefined4 *)&pCursor[0xe].pVtab = 1;
      pCursor[6].pVtab = (sqlite3_vtab *)pExpr->iDocid;
    } while ((uVar2 == '\0') &&
            (iVar4 = sqlite3Fts3EvalTestDeferred((Fts3Cursor *)pCursor,&local_2c), iVar4 != 0));
    iVar4 = local_2c;
    if (local_2c != 0) goto LAB_001adf5f;
  }
  if (*(char *)((long)&pCursor[9].pVtab + 4) == '\0') {
    if ((long)pCursor[0xd].pVtab < (long)pCursor[6].pVtab) goto LAB_001adf59;
  }
  else if ((long)pCursor[6].pVtab < (long)pCursor[0xc].pVtab) {
LAB_001adf59:
    *(undefined1 *)((long)&pCursor[1].pVtab + 2) = 1;
  }
  iVar4 = 0;
LAB_001adf5f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int fts3NextMethod(sqlite3_vtab_cursor *pCursor){
  int rc;
  Fts3Cursor *pCsr = (Fts3Cursor *)pCursor;
  if( pCsr->eSearch==FTS3_DOCID_SEARCH || pCsr->eSearch==FTS3_FULLSCAN_SEARCH ){
    Fts3Table *pTab = (Fts3Table*)pCursor->pVtab;
    pTab->bLock++;
    if( SQLITE_ROW!=sqlite3_step(pCsr->pStmt) ){
      pCsr->isEof = 1;
      rc = sqlite3_reset(pCsr->pStmt);
    }else{
      pCsr->iPrevId = sqlite3_column_int64(pCsr->pStmt, 0);
      rc = SQLITE_OK;
    }
    pTab->bLock--;
  }else{
    rc = fts3EvalNext((Fts3Cursor *)pCursor);
  }
  assert( ((Fts3Table *)pCsr->base.pVtab)->pSegments==0 );
  return rc;
}